

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O0

void __thiscall
cmCTestP4::DescribeParser::DescribeParser(DescribeParser *this,cmCTestP4 *p4,char *prefix)

{
  char *prefix_local;
  cmCTestP4 *p4_local;
  DescribeParser *this_local;
  
  cmProcessTools::LineParser::LineParser(&this->super_LineParser,'\n',false);
  (this->super_LineParser).super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__DescribeParser_011ce200;
  cmsys::RegularExpression::RegularExpression(&this->RegexHeader);
  cmsys::RegularExpression::RegularExpression(&this->RegexDiff);
  this->P4 = p4;
  std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::vector
            (&this->Changes);
  this->Section = SectionHeader;
  cmCTestVC::Revision::Revision(&this->Rev);
  cmProcessTools::LineParser::SetLog
            (&this->super_LineParser,(this->P4->super_cmCTestGlobalVC).super_cmCTestVC.Log,prefix);
  cmsys::RegularExpression::compile(&this->RegexHeader,"^Change ([0-9]+) by (.+)@(.+) on (.*)$");
  cmsys::RegularExpression::compile(&this->RegexDiff,"^\\.\\.\\. (.*)#[0-9]+ ([^ ]+)$");
  return;
}

Assistant:

DescribeParser(cmCTestP4* p4, const char* prefix)
    : LineParser('\n', false)
    , P4(p4)
  {
    this->SetLog(&this->P4->Log, prefix);
    this->RegexHeader.compile("^Change ([0-9]+) by (.+)@(.+) on (.*)$");
    this->RegexDiff.compile(R"(^\.\.\. (.*)#[0-9]+ ([^ ]+)$)");
  }